

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testSchemaReadWrite(DataFileTest *this)

{
  size_t __n;
  void *__buf;
  void *__buf_00;
  DataFileReader<unsigned_int> *this_00;
  uint32_t b;
  DataFileReader<unsigned_int> df_1;
  uint32_t a;
  DataFileWriter<unsigned_int> df;
  char *local_48;
  char *local_40;
  const_string local_38;
  const_string local_28;
  
  a = 0x2a;
  __n = 0x4000;
  avro::DataFileWriter<unsigned_int>::DataFileWriter
            (&df,this->filename,&this->writerSchema,0x4000,NULL_CODEC);
  avro::DataFileWriter<unsigned_int>::write(&df,(int)&a,__buf,__n);
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&df.base_);
  this_00 = &df_1;
  avro::DataFileReader<unsigned_int>::DataFileReader(this_00,this->filename);
  avro::DataFileReader<unsigned_int>::read(this_00,(int)&b,__buf_00,__n);
  local_28.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_28.m_end = "";
  local_38.m_begin = "";
  local_38.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_28,0x1c0,&local_38);
  df.base_._M_ptr = (auto_ptr<avro::DataFileWriterBase>)&PTR__lazy_ostream_001d0ff0;
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_40 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&df,&local_48,0x1c0,1,2,&b,"b",&a,"a");
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df_1.base_);
  return;
}

Assistant:

void testSchemaReadWrite() {
    uint32_t a=42;
    {
            avro::DataFileWriter<uint32_t> df(filename, writerSchema);
        df.write(a);    
        }

        {
        avro::DataFileReader<uint32_t> df(filename);
        uint32_t b;
            df.read(b);
            BOOST_CHECK_EQUAL(b, a);
    }
    }